

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<float> fmt::v9::detail::dragonbox::to_decimal<float>(float x)

{
  undefined1 auVar1 [16];
  char cVar2;
  compute_mul_parity_result cVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  cache_entry_type cache;
  ulong local_40;
  ulong local_38;
  
  uVar14 = (uint)x & 0x7fffff;
  uVar6 = (uint)x >> 0x17 & 0xff;
  if (uVar6 == 0) {
    uVar6 = 0xffffff6b;
    if (uVar14 == 0) {
      uVar13 = 0;
      uVar4 = 0;
      goto LAB_0022e492;
    }
LAB_0022e1ef:
    uVar12 = (int)(uVar6 * 0x4d105) >> 0x14;
    uVar13 = (ulong)uVar12;
    if (0x4d < 0x20 - uVar12) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                  ,299,"k is out of range");
    }
    local_40 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                         (ulong)(0x20 - uVar12) * 8);
    iVar7 = ((int)((1 - uVar12) * 0x1a934f) >> 0x13) + uVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_40;
    auVar1 = auVar1 * (ZEXT416(uVar14 * 2 + 1 << ((byte)iVar7 & 0x1f)) << 0x20);
    uVar4 = auVar1._8_8_ >> 0x20;
    iVar9 = (int)(uVar4 / 100);
    iVar8 = (int)(uVar4 / 100);
    uVar6 = iVar8 * -100 + auVar1._12_4_;
    uVar12 = (uint)(local_40 >> (~(byte)iVar7 & 0x3f));
    if (uVar6 < uVar12) {
      if ((uVar6 != 0) || ((auVar1._8_4_ != 0 || ((uVar14 & 1) == 0)))) {
LAB_0022e2d8:
        if (auVar1._12_4_ >> 2 < 0x19) {
LAB_0022e4c3:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                      ,0x480,"");
        }
        uVar14 = (uint)uVar13;
        uVar13 = uVar4 / 100;
        uVar6 = 0;
        do {
          uVar12 = uVar6;
          uVar10 = uVar13;
          iVar7 = (int)uVar10;
          uVar16 = iVar7 * 0x40000000 | (uint)(iVar7 * -0x3d70a3d7) >> 2;
          uVar13 = (ulong)uVar16;
          uVar6 = uVar12 + 2;
        } while (uVar16 < 0x28f5c29);
        uVar6 = (uint)(iVar7 * -0x33333333) >> 1 | (uint)((iVar7 * -0x33333333 & 1U) != 0) << 0x1f;
        uVar4 = (ulong)uVar6;
        if (uVar6 >= 0x1999999a) {
          uVar4 = uVar10;
        }
        uVar12 = uVar12 | uVar6 < 0x1999999a;
        goto LAB_0022e47e;
      }
      iVar9 = iVar8 + -1;
      uVar6 = 100;
    }
    else if ((uVar6 <= uVar12) &&
            (local_38 = uVar13,
            cVar3 = cache_accessor<float>::compute_mul_parity(uVar14 * 2 - 1,&local_40,iVar7),
            uVar13 = local_38,
            (~uVar14 & (uint)((ushort)cVar3 >> 8) & 1) != 0 || ((ushort)cVar3 & 1) != 0))
    goto LAB_0022e2d8;
    uVar6 = uVar6 - (uVar12 >> 1);
    uVar12 = uVar6 + 5;
    if (100 < uVar12) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x103,"n is too large");
    }
    uVar12 = uVar12 * 0x199a;
    uVar15 = uVar12 >> 0x10;
    uVar16 = uVar15 + iVar9 * 10;
    uVar4 = (ulong)uVar16;
    if ((uVar12 & 0xffff) < 0x199a) {
      cVar3 = cache_accessor<float>::compute_mul_parity(uVar14 * 2,&local_40,iVar7);
      if ((uVar6 & 1) == ((ushort)cVar3 & 1)) {
        uVar16 = uVar16 - (uVar15 & (ushort)cVar3 >> 8 & 1);
      }
      else {
        uVar16 = uVar16 - 1;
      }
      uVar4 = (ulong)uVar16;
    }
  }
  else {
    uVar6 = uVar6 - 0x96;
    if (uVar14 != 0) {
      uVar14 = uVar14 | 0x800000;
      goto LAB_0022e1ef;
    }
    uVar14 = (int)(uVar6 * 0x9a209 + -0x3fe1f) >> 0x15;
    uVar13 = (ulong)uVar14;
    cVar2 = (char)((int)(uVar14 * -0x1a934f) >> 0x13) + (char)uVar6;
    uVar4 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar14) * 8);
    bVar5 = 0x28 - cVar2;
    uVar10 = (uVar4 >> 0x18) + uVar4 >> (bVar5 & 0x3f);
    uVar12 = (uint)((uVar6 & 0xfffffffe) != 2) + (int)(uVar4 - (uVar4 >> 0x19) >> (bVar5 & 0x3f));
    uVar11 = uVar10 & 0xffffffff;
    if ((uint)((int)(uVar11 / 10) * 10) < uVar12) {
      uVar14 = (int)(uVar4 >> (0x27U - cVar2 & 0x3f)) + 1U >> 1;
      if (uVar6 == 0xffffffdd) {
        uVar4 = (ulong)(uVar14 & 0xfffffffe);
      }
      else {
        uVar4 = (ulong)(uVar14 + (uVar14 < uVar12));
      }
      goto LAB_0022e492;
    }
    if ((uint)uVar10 < 10) goto LAB_0022e4c3;
    uVar13 = uVar11 / 10;
    uVar6 = 0;
    do {
      uVar12 = uVar6;
      uVar10 = uVar13;
      iVar7 = (int)uVar10;
      uVar16 = iVar7 * 0x40000000 | (uint)(iVar7 * -0x3d70a3d7) >> 2;
      uVar13 = (ulong)uVar16;
      uVar6 = uVar12 + 2;
    } while (uVar16 < 0x28f5c29);
    uVar6 = (uint)(iVar7 * -0x33333333) >> 1 | (uint)((iVar7 * -0x33333333 & 1U) != 0) << 0x1f;
    uVar4 = (ulong)uVar6;
    if (uVar6 >= 0x1999999a) {
      uVar4 = uVar10;
    }
    uVar12 = uVar12 | uVar6 < 0x1999999a;
LAB_0022e47e:
    uVar13 = (ulong)(uVar14 + 1 + uVar12);
  }
LAB_0022e492:
  return (decimal_fp<float>)(uVar4 | uVar13 << 0x20);
}

Assistant:

static uint64_t get_cached_power(int k) noexcept {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }